

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 *puVar1;
  pointer pMVar2;
  uint uVar3;
  int _elempack;
  uint uVar4;
  Mat *src;
  ulong _elemsize;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  pointer pMVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  int iVar16;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  undefined4 *puVar20;
  int iVar21;
  int iVar22;
  void *pvVar23;
  int iVar24;
  undefined4 *puVar25;
  void *pvVar26;
  long lVar27;
  int iVar28;
  void *pvVar29;
  ulong uVar30;
  long lVar31;
  void *pvVar32;
  bool bVar33;
  Mat local_78;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar3 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar8 = (ulong)_elempack;
  lVar31 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar12 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar3 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      iVar16 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar27 = 0;
      iVar28 = 0;
      uVar30 = 0;
      do {
        uVar4 = *(uint *)(lVar31 + uVar30 * 4);
        uVar9 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar16 * _elempack - iVar28) / (uVar14 + lVar27);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar24 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar24),_elemsize / uVar8 << bVar7 * '\x02',iVar24,
                    opt->blob_allocator);
        pvVar29 = *(void **)((long)&pMVar11->data + lVar13);
        if (pvVar29 == (void *)0x0) {
          bVar33 = true;
        }
        else {
          bVar33 = (long)*(int *)((long)&pMVar11->c + lVar13) *
                   *(long *)((long)&pMVar11->cstep + lVar13) == 0;
        }
        if (bVar33) {
          return -100;
        }
        memcpy(pvVar29,(void *)((long)iVar28 * 4 + (long)src->data),
               (long)*(int *)((long)&pMVar11->w + lVar13) *
               *(long *)((long)&pMVar11->elemsize + lVar13));
        iVar28 = (int)uVar9 + iVar28;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar27 = lVar27 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar30 < uVar14);
    }
  }
  iVar12 = (iVar12 >> 0x1f & uVar3) + iVar12;
  if ((uVar3 == 2) && (iVar12 == 0)) {
    iVar16 = src->w;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar33 = lVar13 != 0;
    if (bVar33) {
      iVar28 = src->h;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar27 = 0;
      lVar13 = 0;
      iVar24 = 0;
      uVar30 = 0;
      do {
        uVar4 = *(uint *)(lVar31 + uVar30 * 4);
        uVar9 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar28 * _elempack - iVar24) / (uVar14 + lVar13);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar19 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar27),iVar16,
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar19),_elemsize / uVar8 << bVar7 * '\x02',iVar19,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar27) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar27) * *(long *)((long)&pMVar11->cstep + lVar27)
            == 0) {
          return -100;
        }
        iVar24 = iVar24 + (int)uVar9;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar27 = lVar27 + 0x48;
        bVar33 = uVar30 < uVar14;
      } while (bVar33);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar28 = pMVar11->elempack;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar10 = &pMVar11->elempack;
      do {
        if (*piVar10 < iVar28) {
          iVar28 = *piVar10;
        }
        piVar10 = piVar10 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_78.data = src->data;
    piVar10 = src->refcount;
    local_78.refcount._0_4_ = SUB84(piVar10,0);
    local_78.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
    local_78.elemsize._0_4_ = (undefined4)src->elemsize;
    local_78.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_78.elempack = src->elempack;
    local_78.allocator = src->allocator;
    local_78.dims = src->dims;
    local_78.w = src->w;
    local_78.h = src->h;
    local_78.d = src->d;
    local_78.c = src->c;
    local_78.cstep = src->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    if (iVar28 < _elempack) {
      convert_packing(src,&local_78,iVar28,opt);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar11) {
      lVar13 = (long)iVar16;
      uVar14 = 0;
      puVar17 = (undefined4 *)local_78.data;
      do {
        pMVar11 = pMVar11 + uVar14;
        iVar24 = pMVar11->elempack;
        if (((iVar28 == 1) && (iVar24 == 4)) && (iVar19 = pMVar11->h, 0 < (long)iVar19)) {
          pvVar29 = pMVar11->data;
          iVar22 = pMVar11->w;
          sVar5 = pMVar11->elemsize;
          lVar27 = 0;
          do {
            if (0 < iVar16) {
              puVar20 = (undefined4 *)((long)iVar22 * sVar5 * lVar27 + (long)pvVar29);
              puVar25 = puVar17;
              iVar21 = iVar16;
              do {
                *puVar20 = *puVar25;
                puVar20[1] = puVar25[lVar13];
                puVar20[2] = puVar25[iVar16 * 2];
                puVar1 = puVar25 + iVar16 * 3;
                puVar25 = puVar25 + 1;
                puVar20[3] = *puVar1;
                puVar20 = puVar20 + 4;
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            puVar17 = puVar17 + lVar13 * 4;
            lVar27 = lVar27 + 1;
          } while (lVar27 != iVar19);
        }
        if (iVar28 == iVar24) {
          lVar27 = pMVar11->h * lVar13;
          memcpy(pMVar11->data,puVar17,pMVar11->elemsize * lVar27);
          puVar17 = puVar17 + (long)(int)lVar27 * (long)pMVar11->elempack;
        }
        uVar14 = uVar14 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    if (bVar33) {
      return -100;
    }
  }
  if ((uVar3 == 2) && (iVar12 == 1)) {
    uVar4 = src->h;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar33 = lVar13 != 0;
    if (bVar33) {
      iVar16 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar27 = 0;
      lVar13 = 0;
      iVar28 = 0;
      uVar30 = 0;
      do {
        iVar24 = *(int *)(lVar31 + uVar30 * 4);
        if (iVar24 == -0xe9) {
          iVar24 = (int)((ulong)((long)iVar16 - (long)iVar28) / (uVar14 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar27),iVar24,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar27) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar27) * *(long *)((long)&pMVar11->cstep + lVar27)
            == 0) {
          return -100;
        }
        iVar28 = iVar28 + iVar24;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar27 = lVar27 + 0x48;
        bVar33 = uVar30 < uVar14;
      } while (bVar33);
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar11) {
          pvVar29 = (void *)((long)src->w * uVar14 * src->elemsize + (long)src->data);
          lVar13 = 0x2c;
          uVar30 = 0;
          do {
            lVar27 = (long)*(int *)((long)&pMVar11->data + lVar13);
            memcpy((void *)(uVar14 * lVar27 * *(long *)((long)pMVar11 + lVar13 + -0x1c) +
                           *(long *)((long)pMVar11 + lVar13 + -0x2c)),pvVar29,lVar27 * _elemsize);
            pvVar29 = (void *)((long)pvVar29 +
                              (long)*(int *)((long)&pMVar11->data + lVar13) * uVar8 * 4);
            uVar30 = uVar30 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar13 = lVar13 + 0x48;
          } while (uVar30 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    if (bVar33) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar12 == 0)) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar33 = lVar13 != 0;
    if (bVar33) {
      iVar16 = src->w;
      iVar28 = src->h;
      iVar24 = src->c;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar27 = 0;
      lVar13 = 0;
      uVar30 = 0;
      iVar19 = 0;
      do {
        uVar4 = *(uint *)(lVar31 + uVar30 * 4);
        uVar9 = (ulong)uVar4;
        if (uVar4 == 0xffffff17) {
          uVar9 = (ulong)(long)(iVar24 * _elempack - iVar19) / (uVar14 + lVar13);
        }
        bVar7 = (uVar9 & 3) == 0 & opt->use_packing_layout;
        iVar22 = (uint)bVar7 + (uint)bVar7 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar11->data + lVar27),iVar16,iVar28,
                    (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                         (long)iVar22),_elemsize / uVar8 << bVar7 * '\x02',iVar22,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar27) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar27) * *(long *)((long)&pMVar11->cstep + lVar27)
            == 0) {
          return -100;
        }
        iVar19 = iVar19 + (int)uVar9;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar27 = lVar27 + 0x48;
        bVar33 = uVar30 < uVar14;
      } while (bVar33);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar16 = pMVar11->elempack;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar13 != 0) {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar10 = &pMVar11->elempack;
      do {
        if (*piVar10 < iVar16) {
          iVar16 = *piVar10;
        }
        piVar10 = piVar10 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_78.data = src->data;
    piVar10 = src->refcount;
    local_78.refcount._0_4_ = SUB84(piVar10,0);
    local_78.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
    local_78.elemsize._0_4_ = (undefined4)src->elemsize;
    local_78.elemsize._4_4_ = (undefined4)(src->elemsize >> 0x20);
    local_78.elempack = src->elempack;
    local_78.allocator = src->allocator;
    local_78.dims = src->dims;
    local_78.w = src->w;
    local_78.h = src->h;
    local_78.d = src->d;
    local_78.c = src->c;
    local_78.cstep = src->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    if (iVar16 < _elempack) {
      convert_packing(src,&local_78,iVar16,opt);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar11) {
      uVar14 = 0;
      uVar30 = 0;
      do {
        pMVar2 = pMVar11 + uVar14;
        if (((iVar16 == 1) && (pMVar11[uVar14].elempack == 4)) &&
           (iVar28 = pMVar2->c, 0 < (long)iVar28)) {
          iVar24 = pMVar2->h * pMVar2->w;
          pvVar29 = pMVar2->data;
          sVar5 = pMVar2->cstep;
          sVar6 = pMVar2->elemsize;
          uVar30 = (ulong)(int)uVar30;
          lVar27 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
          pvVar23 = (void *)((uVar30 + 3) * lVar27 + (long)local_78.data);
          lVar13 = lVar27 * 4;
          pvVar26 = (void *)((uVar30 + 2) * lVar27 + (long)local_78.data);
          pvVar32 = (void *)((uVar30 + 1) * lVar27 + (long)local_78.data);
          pvVar15 = (void *)(lVar27 * uVar30 + (long)local_78.data);
          lVar27 = 0;
          do {
            if (0 < iVar24) {
              puVar17 = (undefined4 *)(sVar5 * sVar6 * lVar27 + (long)pvVar29);
              lVar18 = 0;
              do {
                *puVar17 = *(undefined4 *)((long)pvVar15 + lVar18 * 4);
                puVar17[1] = *(undefined4 *)((long)pvVar32 + lVar18 * 4);
                puVar17[2] = *(undefined4 *)((long)pvVar26 + lVar18 * 4);
                puVar17[3] = *(undefined4 *)((long)pvVar23 + lVar18 * 4);
                puVar17 = puVar17 + 4;
                lVar18 = lVar18 + 1;
              } while (iVar24 != (int)lVar18);
            }
            uVar30 = uVar30 + 4;
            lVar27 = lVar27 + 1;
            pvVar23 = (void *)((long)pvVar23 + lVar13);
            pvVar26 = (void *)((long)pvVar26 + lVar13);
            pvVar32 = (void *)((long)pvVar32 + lVar13);
            pvVar15 = (void *)((long)pvVar15 + lVar13);
          } while (lVar27 != iVar28);
        }
        if (iVar16 == pMVar2->elempack) {
          memcpy(pMVar2->data,
                 (void *)(local_78.cstep * (long)(int)uVar30 *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                         (long)local_78.data),
                 (long)((int)pMVar2->cstep * pMVar2->c) * pMVar2->elemsize);
          uVar30 = (ulong)(uint)((int)uVar30 + pMVar2->c);
        }
        uVar14 = uVar14 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)(((long)(top_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    if (bVar33) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar12 == 1)) {
    uVar4 = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar33 = lVar13 != 0;
    if (bVar33) {
      iVar16 = src->w;
      iVar28 = src->h;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar27 = 0;
      lVar13 = 0;
      uVar30 = 0;
      iVar24 = 0;
      do {
        iVar19 = *(int *)(lVar31 + uVar30 * 4);
        if (iVar19 == -0xe9) {
          iVar19 = (int)((ulong)((long)iVar28 - (long)iVar24) / (uVar14 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar27),iVar16,iVar19,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar27) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar27) * *(long *)((long)&pMVar11->cstep + lVar27)
            == 0) {
          return -100;
        }
        iVar24 = iVar24 + iVar19;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar27 = lVar27 + 0x48;
        bVar33 = uVar30 < uVar14;
      } while (bVar33);
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar11) {
          pvVar29 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          lVar13 = 0x40;
          uVar30 = 0;
          do {
            lVar27 = (long)*(int *)((long)pMVar11 + lVar13 + -0x10) *
                     (long)*(int *)((long)pMVar11 + lVar13 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar11->data + lVar13) * uVar14 *
                            *(long *)((long)pMVar11 + lVar13 + -0x30) +
                           *(long *)((long)pMVar11 + lVar13 + -0x40)),pvVar29,lVar27 * _elemsize);
            pvVar29 = (void *)((long)pvVar29 + (long)((int)lVar27 * _elempack) * 4);
            uVar30 = uVar30 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            lVar13 = lVar13 + 0x48;
          } while (uVar30 < (ulong)(((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    if (bVar33) {
      return -100;
    }
  }
  if ((uVar3 == 3) && (iVar12 == 2)) {
    uVar3 = src->h;
    uVar4 = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar11;
    bVar33 = lVar13 != 0;
    if (bVar33) {
      iVar12 = src->w;
      uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar27 = 0;
      uVar30 = 0;
      iVar16 = 0;
      do {
        iVar28 = *(int *)(lVar31 + uVar30 * 4);
        if (iVar28 == -0xe9) {
          iVar28 = (int)((ulong)((long)iVar12 - (long)iVar16) / (uVar14 + lVar27));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),iVar28,uVar3,uVar4,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar13) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar13) * *(long *)((long)&pMVar11->cstep + lVar13)
            == 0) {
          return -100;
        }
        iVar16 = iVar16 + iVar28;
        uVar30 = uVar30 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar27 = lVar27 + -1;
        lVar13 = lVar13 + 0x48;
        bVar33 = uVar30 < uVar14;
      } while (bVar33);
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar29 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          uVar30 = 0;
          do {
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            if ((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar11) {
              lVar31 = 0x40;
              uVar9 = 0;
              do {
                lVar27 = (long)*(int *)((long)pMVar11 + lVar31 + -0x14);
                lVar13 = *(long *)((long)pMVar11 + lVar31 + -0x30);
                memcpy((void *)(uVar30 * lVar27 * lVar13 +
                               *(long *)((long)&pMVar11->data + lVar31) * uVar14 * lVar13 +
                               *(long *)((long)pMVar11 + lVar31 + -0x40)),pvVar29,lVar27 * _elemsize
                      );
                pvVar29 = (void *)((long)pvVar29 +
                                  (long)*(int *)((long)pMVar11 + lVar31 + -0x14) * uVar8 * 4);
                uVar9 = uVar9 + 1;
                pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                lVar31 = lVar31 + 0x48;
              } while (uVar9 < (ulong)(((long)(top_blobs->
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar11 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar3);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    if (bVar33) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}